

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

void Acb_ObjUpdatePriority(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Que_t *pVVar4;
  float **pCosts;
  int nPaths;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsCio(p,iObj);
  if ((iVar1 == 0) && (iVar1 = Acb_ObjLevelD(p,iObj), iVar1 != 1)) {
    if (p->vQue == (Vec_Que_t *)0x0) {
      Acb_NtkCleanObjCounts(p);
      pVVar4 = Vec_QueAlloc(1000);
      p->vQue = pVVar4;
      pVVar4 = p->vQue;
      pCosts = Vec_FltArrayP(&p->vCounts);
      Vec_QueSetPriority(pVVar4,pCosts);
    }
    iVar1 = Acb_ObjPathD(p,iObj);
    iVar2 = Acb_ObjPathR(p,iObj);
    Acb_ObjSetCounts(p,iObj,(float)(iVar1 * iVar2));
    iVar3 = Vec_QueIsMember(p->vQue,iObj);
    if (iVar3 == 0) {
      if (iVar1 * iVar2 != 0) {
        Vec_QuePush(p->vQue,iObj);
      }
    }
    else {
      Vec_QueUpdate(p->vQue,iObj);
    }
  }
  return;
}

Assistant:

void Acb_ObjUpdatePriority( Acb_Ntk_t * p, int iObj )
{
    int nPaths;
    if ( Acb_ObjIsCio(p, iObj) || Acb_ObjLevelD(p, iObj) == 1 )
        return;
    if ( p->vQue == NULL )
    {
        Acb_NtkCleanObjCounts( p );
        p->vQue = Vec_QueAlloc( 1000 );
        Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    }
    nPaths = Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj);
    Acb_ObjSetCounts( p, iObj, (float)nPaths );
    if ( Vec_QueIsMember( p->vQue, iObj ) )
    {
//printf( "Updating object %d with count %d\n", iObj, nPaths );
        Vec_QueUpdate( p->vQue, iObj );
    }
    else if ( nPaths )
    {
//printf( "Adding object %d with count %d\n", iObj, nPaths );
        Vec_QuePush( p->vQue, iObj );
    }
}